

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_finite_automaton.cpp
# Opt level: O0

FiniteAutomaton *
Omega_h::make_char_set_nfa
          (FiniteAutomaton *__return_storage_ptr__,
          set<char,_std::less<char>,_std::allocator<char>_> *accepted,int token)

{
  bool bVar1;
  reference pcVar2;
  int local_70;
  char local_69;
  iterator iStack_68;
  char c;
  iterator __end1;
  iterator __begin1;
  set<char,_std::less<char>,_std::allocator<char>_> *__range1;
  set<int,_std::less<int>,_std::allocator<int>_> symbol_set;
  int token_local;
  set<char,_std::less<char>,_std::allocator<char>_> *accepted_local;
  
  symbol_set._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = token;
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)&__range1);
  __end1 = std::set<char,_std::less<char>,_std::allocator<char>_>::begin(accepted);
  iStack_68 = std::set<char,_std::less<char>,_std::allocator<char>_>::end(accepted);
  while( true ) {
    bVar1 = std::operator!=(&__end1,&stack0xffffffffffffff98);
    if (!bVar1) break;
    pcVar2 = std::_Rb_tree_const_iterator<char>::operator*(&__end1);
    local_69 = *pcVar2;
    local_70 = get_symbol(local_69);
    std::set<int,_std::less<int>,_std::allocator<int>_>::insert
              ((set<int,_std::less<int>,_std::allocator<int>_> *)&__range1,&local_70);
    std::_Rb_tree_const_iterator<char>::operator++(&__end1);
  }
  FiniteAutomaton::make_set_nfa
            (__return_storage_ptr__,0x62,(set<int,_std::less<int>,_std::allocator<int>_> *)&__range1
             ,symbol_set._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_);
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)&__range1);
  return __return_storage_ptr__;
}

Assistant:

FiniteAutomaton make_char_set_nfa(std::set<char> const& accepted, int token) {
  std::set<int> symbol_set;
  for (auto c : accepted) symbol_set.insert(get_symbol(c));
  return FiniteAutomaton::make_set_nfa(Omega_h::NCHARS, symbol_set, token);
}